

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O1

Instr * Lowerer::PeepShiftAdd(Instr *instrAdd)

{
  Opnd *this;
  Opnd *opnd;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  
  if (instrAdd->m_opcode != Add_I4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                       ,0xa3,"(instrAdd->m_opcode == Js::OpCode::Add_I4)",
                       "instrAdd->m_opcode == Js::OpCode::Add_I4");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = instrAdd;
  if (((instrAdd->field_0x38 & 0x10) == 0) &&
     (OVar3 = IR::Opnd::GetKind(instrAdd->m_dst), OVar3 == OpndKindReg)) {
    this = instrAdd->m_src1;
    opnd = instrAdd->m_src2;
    bVar2 = IR::Opnd::IsEqual(this,opnd);
    if ((!bVar2) && (pIVar5 = TryShiftAdd(instrAdd,this,opnd), pIVar5->m_opcode == Add_I4)) {
      pIVar5 = TryShiftAdd(instrAdd,opnd,this);
      return pIVar5;
    }
  }
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::PeepShiftAdd(IR::Instr *instrAdd)
{
    Assert(instrAdd->m_opcode == Js::OpCode::Add_I4);

    // Peep:
    //    t1 = SHL X, 0|1|2|3    / t1 = MUL X, 1|2|4|8
    //    t2 = ADD t1, Y
    //
    // Into:
    //    t2 = LEA [X * scale + Y]

    if (instrAdd->HasBailOutInfo())
    {
        return instrAdd;
    }

    if (!instrAdd->GetDst()->IsRegOpnd())
    {
        return instrAdd;
    }

    IR::Opnd * src2 = instrAdd->GetSrc2();
    IR::Opnd * src1 = instrAdd->GetSrc1();

    // we can't remove t1 in case both srcs are uses of t1
    if (src1->IsEqual(src2))
    {
        return instrAdd;
    }
    IR::Instr * resultInstr = TryShiftAdd(instrAdd, src1, src2);
    if (resultInstr->m_opcode == Js::OpCode::Add_I4)
    {
        resultInstr = TryShiftAdd(instrAdd, src2, src1);
    }
    return resultInstr;

}